

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.hpp
# Opt level: O0

void __thiscall xe::xml::Writer::Attribute::Attribute(Attribute *this,char *name_,string *value_)

{
  allocator<char> local_21;
  string *local_20;
  string *value__local;
  char *name__local;
  Attribute *this_local;
  
  local_20 = value_;
  value__local = (string *)name_;
  name__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_21);
  std::allocator<char>::~allocator(&local_21);
  std::__cxx11::string::string((string *)&this->value,(string *)local_20);
  return;
}

Assistant:

Attribute (const char* name_, const std::string& value_) : name(name_), value(value_) {}